

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdevicediscovery_udev_p.cpp
# Opt level: O1

void QDeviceDiscoveryUDev::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  udev_device *dev;
  char *pcVar8;
  long lVar9;
  udev_device *dev_00;
  storage_type *psVar10;
  char *pcVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QArrayData *pQStack_68;
  char16_t *pcStack_60;
  qsizetype qStack_58;
  QString QStack_48;
  long lStack_28;
  
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  lStack_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(_o + 0x20) == 0) goto LAB_001157aa;
  QStack_48.d.d = (Data *)0x0;
  QStack_48.d.ptr = (char16_t *)0x0;
  QStack_48.d.size = 0;
  dev = (udev_device *)udev_monitor_receive_device();
  if (dev != (udev_device *)0x0) {
    pcVar8 = (char *)udev_device_get_action(dev);
    if (pcVar8 != (char *)0x0) {
      lVar9 = udev_device_get_devnode(dev);
      if (lVar9 != 0) {
        psVar10 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar11 = psVar10 + lVar9 + 1;
          psVar10 = psVar10 + 1;
        } while (*pcVar11 != '\0');
        QVar12.m_data = psVar10;
        QVar12.m_size = (qsizetype)&pQStack_68;
        QString::fromUtf8(QVar12);
        pcVar4 = QStack_48.d.ptr;
        pDVar3 = QStack_48.d.d;
        qVar2 = qStack_58;
        pQVar1 = pQStack_68;
        pQStack_68 = &(QStack_48.d.d)->super_QArrayData;
        QStack_48.d.d = (Data *)pQVar1;
        QStack_48.d.ptr = pcStack_60;
        pcStack_60 = pcVar4;
        qStack_58 = QStack_48.d.size;
        QStack_48.d.size = qVar2;
        if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
          }
        }
        QVar13.m_data = (char *)0x10;
        QVar13.m_size = (qsizetype)&QStack_48;
        cVar5 = QString::startsWith(QVar13,0x11720a);
        if (cVar5 == '\0') {
          QVar14.m_data = (char *)0xd;
          QVar14.m_size = (qsizetype)&QStack_48;
          cVar5 = QString::startsWith(QVar14,0x11721b);
          if (cVar5 == '\0') goto LAB_0011577f;
          pcVar11 = "drm";
        }
        else {
          pcVar11 = "input";
        }
        bVar6 = checkDeviceType((QDeviceDiscoveryUDev *)_o,dev);
        if (bVar6) {
LAB_0011573f:
          iVar7 = qstrcmp(pcVar8,"add");
          if (iVar7 == 0) {
            QDeviceDiscovery::deviceDetected((QDeviceDiscovery *)_o,&QStack_48);
          }
          iVar7 = qstrcmp(pcVar8,"remove");
          if (iVar7 == 0) {
            QDeviceDiscovery::deviceRemoved((QDeviceDiscovery *)_o,&QStack_48);
          }
        }
        else {
          dev_00 = (udev_device *)udev_device_get_parent_with_subsystem_devtype(dev,pcVar11,0);
          if (dev_00 != (udev_device *)0x0) {
            bVar6 = checkDeviceType((QDeviceDiscoveryUDev *)_o,dev_00);
            if (bVar6) goto LAB_0011573f;
          }
        }
      }
    }
  }
LAB_0011577f:
  udev_device_unref(dev);
  if (&(QStack_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((QStack_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((QStack_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(QStack_48.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_001157aa:
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDeviceDiscoveryUDev::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDeviceDiscoveryUDev *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->handleUDevNotification(); break;
        default: ;
        }
    }
    (void)_a;
}